

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

string * bytesToHexString_abi_cxx11_(string *__return_storage_ptr__,uint8_t *str,uint64_t s)

{
  uint *puVar1;
  long lVar2;
  uint64_t uVar3;
  ostringstream ret;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (s != 0) {
    uVar3 = 0;
    do {
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      lVar2 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar2 + 1] == '\0') {
        std::ios::widen((char)local_1a8 + (char)lVar2);
        acStack_c8[lVar2 + 1] = '\x01';
      }
      acStack_c8[lVar2] = '0';
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 & 0xffffbfff;
      std::ostream::operator<<((ostream *)local_1a8,(uint)str[uVar3]);
      uVar3 = uVar3 + 1;
    } while (s != uVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string bytesToHexString(const uint8_t *str, const uint64_t s)
{
	std::ostringstream ret;

	for (size_t i = 0; i < s; ++i)
		ret << std::hex << std::setfill('0') << std::setw(2) << std::nouppercase << (int) str[i];

	return ret.str();
}